

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandACCT(FtpSession *this,string *param_1)

{
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *param_1_local;
  FtpSession *this_local;
  
  local_18 = param_1;
  param_1_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"Unsupported command",&local_39);
  sendFtpMessage(this,SYNTAX_ERROR_UNRECOGNIZED_COMMAND,(string *)local_38);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void FtpSession::handleFtpCommandACCT(const std::string& /*param*/)
  {
    sendFtpMessage(FtpReplyCode::SYNTAX_ERROR_UNRECOGNIZED_COMMAND, "Unsupported command");
    return;
  }